

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiTable *table;
  float fVar3;
  int iVar4;
  int iVar5;
  bool *pbVar6;
  
  pIVar2 = GImGui->CurrentWindow;
  table = GImGui->CurrentTable;
  if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
    ImGui::TableEndRow(table);
  }
  iVar4 = this->ItemsCount;
  if (iVar4 == 0) goto LAB_0014afad;
  if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
    pbVar6 = &GImGui->CurrentWindow->SkipItems;
  }
  else {
    pbVar6 = &GImGui->CurrentTable->HostSkipItems;
  }
  if (*pbVar6 == true) goto LAB_0014afad;
  iVar5 = this->StepNo;
  if (iVar5 == 1) {
    if (0.0 < this->ItemsHeight) {
      __assert_fail("ItemsHeight <= 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x915,"bool ImGuiListClipper::Step()");
    }
    if (table == (ImGuiTable *)0x0) {
      fVar3 = (pIVar2->DC).CursorPos.y - this->StartPosY;
    }
    else {
      fVar3 = table->RowPosY2 - table->RowPosY1;
      (pIVar2->DC).CursorPos.y = table->RowPosY2;
    }
    this->ItemsHeight = fVar3;
    if (fVar3 <= 0.0) {
      __assert_fail("ItemsHeight > 0.0f && \"Unable to calculate item height! First item hasn\'t moved the cursor vertically!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x921,"bool ImGuiListClipper::Step()");
    }
LAB_0014af36:
    this->StepNo = 2;
    iVar5 = 2;
  }
  else if (iVar5 == 0) {
    if ((table != (ImGuiTable *)0x0) && (table->IsUnfrozenRows == false)) {
      this->DisplayStart = this->ItemsFrozen;
      iVar4 = this->ItemsFrozen + 1;
      this->DisplayEnd = iVar4;
      this->ItemsFrozen = iVar4;
      return true;
    }
    this->StartPosY = (pIVar2->DC).CursorPos.y;
    if (this->ItemsHeight <= 0.0) {
      this->DisplayStart = this->ItemsFrozen;
      this->DisplayEnd = this->ItemsFrozen + 1;
      this->StepNo = 1;
      return true;
    }
    this->DisplayStart = this->DisplayEnd;
    goto LAB_0014af36;
  }
  iVar1 = this->DisplayEnd;
  if (iVar4 - iVar1 != 0 && iVar1 <= iVar4) {
    if (iVar5 == 3) {
      if (iVar4 != 0x7fffffff) {
        SetCursorPosYAndSetupForPrevLine
                  ((float)(iVar4 - this->ItemsFrozen) * this->ItemsHeight + this->StartPosY,
                   this->ItemsHeight);
      }
      this->ItemsCount = -1;
      return false;
    }
    if (iVar5 == 2) {
      if (0.0 < this->ItemsHeight) {
        ImGui::CalcListClipping
                  (iVar4 - iVar1,this->ItemsHeight,&this->DisplayStart,&this->DisplayEnd);
        iVar5 = this->DisplayStart;
        iVar4 = iVar5 + iVar1;
        this->DisplayStart = iVar4;
        this->DisplayEnd = this->DisplayEnd + iVar1;
        if (0 < iVar5) {
          SetCursorPosYAndSetupForPrevLine
                    ((float)(iVar4 - this->ItemsFrozen) * this->ItemsHeight + this->StartPosY,
                     this->ItemsHeight);
        }
        this->StepNo = 3;
        return true;
      }
      __assert_fail("ItemsHeight > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x92f,"bool ImGuiListClipper::Step()");
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x949,"bool ImGuiListClipper::Step()");
  }
LAB_0014afad:
  End(this);
  return false;
}

Assistant:

bool ImGuiListClipper::Step()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImGuiTable* table = g.CurrentTable;
    if (table && table->IsInsideRow)
        ImGui::TableEndRow(table);

    // No items
    if (ItemsCount == 0 || GetSkipItemForListClipping())
    {
        End();
        return false;
    }

    // Step 0: Let you process the first element (regardless of it being visible or not, so we can measure the element height)
    if (StepNo == 0)
    {
        // While we are in frozen row state, keep displaying items one by one, unclipped
        // FIXME: Could be stored as a table-agnostic state.
        if (table != NULL && !table->IsUnfrozenRows)
        {
            DisplayStart = ItemsFrozen;
            DisplayEnd = ItemsFrozen + 1;
            ItemsFrozen++;
            return true;
        }

        StartPosY = window->DC.CursorPos.y;
        if (ItemsHeight <= 0.0f)
        {
            // Submit the first item so we can measure its height (generally it is 0..1)
            DisplayStart = ItemsFrozen;
            DisplayEnd = ItemsFrozen + 1;
            StepNo = 1;
            return true;
        }

        // Already has item height (given by user in Begin): skip to calculating step
        DisplayStart = DisplayEnd;
        StepNo = 2;
    }

    // Step 1: the clipper infer height from first element
    if (StepNo == 1)
    {
        IM_ASSERT(ItemsHeight <= 0.0f);
        if (table)
        {
            const float pos_y1 = table->RowPosY1;   // Using this instead of StartPosY to handle clipper straddling the frozen row
            const float pos_y2 = table->RowPosY2;   // Using this instead of CursorPos.y to take account of tallest cell.
            ItemsHeight = pos_y2 - pos_y1;
            window->DC.CursorPos.y = pos_y2;
        }
        else
        {
            ItemsHeight = window->DC.CursorPos.y - StartPosY;
        }
        IM_ASSERT(ItemsHeight > 0.0f && "Unable to calculate item height! First item hasn't moved the cursor vertically!");
        StepNo = 2;
    }

    // Reached end of list
    if (DisplayEnd >= ItemsCount)
    {
        End();
        return false;
    }

    // Step 2: calculate the actual range of elements to display, and position the cursor before the first element
    if (StepNo == 2)
    {
        IM_ASSERT(ItemsHeight > 0.0f);

        int already_submitted = DisplayEnd;
        ImGui::CalcListClipping(ItemsCount - already_submitted, ItemsHeight, &DisplayStart, &DisplayEnd);
        DisplayStart += already_submitted;
        DisplayEnd += already_submitted;

        // Seek cursor
        if (DisplayStart > already_submitted)
            SetCursorPosYAndSetupForPrevLine(StartPosY + (DisplayStart - ItemsFrozen) * ItemsHeight, ItemsHeight);

        StepNo = 3;
        return true;
    }

    // Step 3: the clipper validate that we have reached the expected Y position (corresponding to element DisplayEnd),
    // Advance the cursor to the end of the list and then returns 'false' to end the loop.
    if (StepNo == 3)
    {
        // Seek cursor
        if (ItemsCount < INT_MAX)
            SetCursorPosYAndSetupForPrevLine(StartPosY + (ItemsCount - ItemsFrozen) * ItemsHeight, ItemsHeight); // advance cursor
        ItemsCount = -1;
        return false;
    }

    IM_ASSERT(0);
    return false;
}